

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtGImpactBvh.cpp
# Opt level: O1

void __thiscall cbtBvhTree::build_tree(cbtBvhTree *this,GIM_BVH_DATA_ARRAY *primitive_boxes)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  undefined8 uVar6;
  void *pvVar7;
  undefined4 *puVar8;
  long lVar9;
  int iVar10;
  
  *(undefined4 *)this = 0;
  iVar3 = (primitive_boxes->super_cbtAlignedObjectArray<GIM_BVH_DATA>).m_size;
  iVar10 = iVar3 * 2;
  iVar4 = *(int *)(this + 0xc);
  if ((iVar4 <= iVar10) && (iVar4 < iVar10)) {
    if (*(int *)(this + 0x10) < iVar10) {
      if (iVar3 == 0) {
        pvVar7 = (void *)0x0;
      }
      else {
        pvVar7 = cbtAlignedAllocInternal((long)iVar3 * 0x48,0x10);
      }
      iVar3 = *(int *)(this + 0xc);
      if (0 < (long)iVar3) {
        lVar9 = 0;
        do {
          lVar5 = *(long *)(this + 0x18);
          uVar6 = ((undefined8 *)(lVar5 + lVar9))[1];
          *(undefined8 *)((long)pvVar7 + lVar9) = *(undefined8 *)(lVar5 + lVar9);
          ((undefined8 *)((long)pvVar7 + lVar9))[1] = uVar6;
          puVar1 = (undefined8 *)(lVar5 + 0x10 + lVar9);
          uVar6 = puVar1[1];
          puVar2 = (undefined8 *)((long)pvVar7 + lVar9 + 0x10);
          *puVar2 = *puVar1;
          puVar2[1] = uVar6;
          *(undefined4 *)((long)pvVar7 + lVar9 + 0x20) = *(undefined4 *)(lVar5 + 0x20 + lVar9);
          lVar9 = lVar9 + 0x24;
        } while ((long)iVar3 * 0x24 != lVar9);
      }
      if (*(void **)(this + 0x18) != (void *)0x0) {
        if (this[0x20] == (cbtBvhTree)0x1) {
          cbtAlignedFreeInternal(*(void **)(this + 0x18));
        }
        *(undefined8 *)(this + 0x18) = 0;
      }
      this[0x20] = (cbtBvhTree)0x1;
      *(void **)(this + 0x18) = pvVar7;
      *(int *)(this + 0x10) = iVar10;
    }
    if (iVar4 < iVar10) {
      puVar8 = (undefined4 *)(*(long *)(this + 0x18) + 0x20 + (long)iVar4 * 0x24);
      lVar9 = (long)iVar10 - (long)iVar4;
      do {
        *puVar8 = 0;
        puVar8 = puVar8 + 9;
        lVar9 = lVar9 + -1;
      } while (lVar9 != 0);
    }
  }
  *(int *)(this + 0xc) = iVar10;
  _build_sub_tree(this,primitive_boxes,0,
                  (primitive_boxes->super_cbtAlignedObjectArray<GIM_BVH_DATA>).m_size);
  return;
}

Assistant:

void cbtBvhTree::build_tree(
	GIM_BVH_DATA_ARRAY& primitive_boxes)
{
	// initialize node count to 0
	m_num_nodes = 0;
	// allocate nodes
	m_node_array.resize(primitive_boxes.size() * 2);

	_build_sub_tree(primitive_boxes, 0, primitive_boxes.size());
}